

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O2

void CompiledMixedType<long_long,signed_char>(void)

{
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> SVar1;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  unaff_RBX;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> su;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_30;
  
  su.m_int = '\0';
  local_30.m_int = 0;
  SafeInt::operator_cast_to_signed_char((SafeInt *)&local_30);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator*((SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
             *)&local_30,'\0');
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator*(&local_30,
            (SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             )0x0);
  operator*('\0',local_30);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator*=((SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
              *)&local_30,'\0');
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator*=((SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
              *)&local_30,
             (SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              )0x0);
  local_30.m_int = 1;
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
             *)&su,(int *)&stack0xffffffffffffffcc);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator%((SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
             *)&local_30,'\x01');
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator%(&local_30,
            (SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             )0x1);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator%=((SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
              *)&local_30,'\x01');
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator%=((SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
              *)&local_30,su);
  local_30.m_int = 1;
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator/((SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
             *)&local_30,'\x01');
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator/(&local_30,
            (SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             )0x1);
  operator/('\x01',local_30);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator/=((SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
              *)&local_30,'\x01');
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator/=((SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
              *)&local_30,su);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator+((SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
             *)&local_30,'\x01');
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator+(&local_30,
            (SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             )0x1);
  operator+('\x01',local_30);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator+=((SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
              *)&local_30,'\x01');
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator+=((SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
              *)&local_30,su);
  local_30.m_int = 0;
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator-((SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
             *)&local_30,'\0');
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator-(&local_30,
            (SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             )0x0);
  operator-('\0',unaff_RBX);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator-=((SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
              *)&local_30,'\0');
  local_30.m_int = 1;
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
             *)&su,(int *)&stack0xffffffffffffffcc);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator-=((SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
              *)&local_30,su);
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
             *)&su,(int *)&stack0xffffffffffffffcc);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator<<((SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
              *)&local_30,'\x01');
  SVar1 = SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
          operator<<((SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                      *)&local_30,su);
  operator<<(SVar1.m_int,su);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator<<=((SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               *)&local_30,'\x01');
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator<<=((SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               *)&local_30,su);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator>>((SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
              *)&local_30,'\x01');
  SVar1 = SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
          operator>>((SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                      *)&local_30,su);
  operator>>(SVar1.m_int,su);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator>>=((SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               *)&local_30,'\x01');
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator>>=((SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               *)&local_30,su);
  BinaryAndHelper<long_long,_signed_char,_1>::And(local_30.m_int,'\x01');
  local_30.m_int = 0;
  local_30.m_int = BinaryAndHelper<long_long,_signed_char,_1>::And(0,'\x01');
  local_30.m_int = BinaryAndHelper<long_long,_signed_char,_1>::And(local_30.m_int,su.m_int);
  BinaryOrHelper<long_long,_signed_char,_1>::Or(local_30.m_int,'\x01');
  local_30.m_int = BinaryOrHelper<long_long,_signed_char,_1>::Or(local_30.m_int,'\x01');
  local_30.m_int = BinaryOrHelper<long_long,_signed_char,_1>::Or(local_30.m_int,su.m_int);
  BinaryXorHelper<long_long,_signed_char,_1>::Xor(local_30.m_int,'\x01');
  local_30.m_int = BinaryXorHelper<long_long,_signed_char,_1>::Xor(local_30.m_int,'\x01');
  BinaryXorHelper<long_long,_signed_char,_1>::Xor(local_30.m_int,su.m_int);
  return;
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}